

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O1

el_action_t em_capitol_case(EditLine *el,wint_t c)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  
  pwVar3 = c__next_word((el->el_line).cursor,(el->el_line).lastchar,(el->el_state).argument,
                        ce__isword);
  pwVar4 = (el->el_line).cursor;
  while( true ) {
    if (pwVar3 <= pwVar4) {
      for (; pwVar4 < pwVar3; pwVar4 = pwVar4 + 1) {
        iVar1 = iswupper(*pwVar4);
        if (iVar1 != 0) {
          wVar2 = towlower(*pwVar4);
LAB_0011736e:
          *pwVar4 = wVar2;
        }
LAB_00117371:
      }
      pwVar4 = (el->el_line).lastchar;
      if (pwVar4 < pwVar3) {
        pwVar3 = pwVar4;
      }
      (el->el_line).cursor = pwVar3;
      return '\x04';
    }
    iVar1 = iswalpha(*pwVar4);
    if (iVar1 != 0) break;
    pwVar4 = pwVar4 + 1;
  }
  iVar1 = iswlower(*pwVar4);
  if (iVar1 == 0) goto LAB_00117371;
  wVar2 = towupper(*pwVar4);
  goto LAB_0011736e;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_capitol_case(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *cp, *ep;

	ep = c__next_word(el->el_line.cursor, el->el_line.lastchar,
	    el->el_state.argument, ce__isword);

	for (cp = el->el_line.cursor; cp < ep; cp++) {
		if (iswalpha(*cp)) {
			if (iswlower(*cp))
				*cp = towupper(*cp);
			cp++;
			break;
		}
	}
	for (; cp < ep; cp++)
		if (iswupper(*cp))
			*cp = towlower(*cp);

	el->el_line.cursor = ep;
	if (el->el_line.cursor > el->el_line.lastchar)
		el->el_line.cursor = el->el_line.lastchar;
	return CC_REFRESH;
}